

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::EventLoop::run(EventLoop *this,uint maxTurnCount)

{
  Event *pEVar1;
  EventPort *pEVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  
  this->running = true;
  if (maxTurnCount != 0) {
    iVar4 = maxTurnCount - 1;
    do {
      bVar3 = turn(this);
      bVar5 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (bVar3 && bVar5);
  }
  pEVar1 = this->head;
  if (this->lastRunnableState != (pEVar1 != (Event *)0x0)) {
    pEVar2 = (this->port).ptr;
    if (pEVar2 != (EventPort *)0x0) {
      (*pEVar2->_vptr_EventPort[2])(pEVar2,(ulong)(pEVar1 != (Event *)0x0));
    }
    this->lastRunnableState = pEVar1 != (Event *)0x0;
  }
  this->running = false;
  return;
}

Assistant:

void EventLoop::run(uint maxTurnCount) {
  running = true;
  KJ_DEFER(running = false);

  for (uint i = 0; i < maxTurnCount; i++) {
    if (!turn()) {
      break;
    }
  }

  setRunnable(isRunnable());
}